

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spriteview.cpp
# Opt level: O2

void __thiscall FSSSpriteView::setSprite(FSSSpriteView *this,PSprite *_sprite)

{
  char cVar1;
  QPixmap pixmap;
  QSize size;
  QSize local_28 [3];
  
  std::__shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sprite).super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>,
             &_sprite->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>);
  QWidget::setBackgroundRole((ColorRole)this->labelImage);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->labelImage,0));
  QLabel::setScaledContents(SUB81(this->labelImage,0));
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->labelImage,0));
  getPixmap((FSSSpriteView *)&pixmap);
  cVar1 = QPixmap::isNull();
  if (cVar1 == '\0') {
    size = (QSize)QPixmap::size();
    QSize::operator*=(&size,2.0);
    QPixmap::scaled(local_28,(AspectRatioMode)&pixmap,(TransformationMode)&size);
    QPixmap::operator=(&pixmap,(QPixmap *)local_28);
    QPixmap::~QPixmap((QPixmap *)local_28);
    QWidget::resize((QSize *)this->labelImage);
  }
  else {
    local_28[0].wd = -1;
    local_28[0].ht = -1;
    QWidget::resize((QSize *)this->labelImage);
  }
  QLabel::setPixmap((QPixmap *)this->labelImage);
  QWidget::update();
  QPixmap::~QPixmap(&pixmap);
  return;
}

Assistant:

void
FSSSpriteView::setSprite(Data::PSprite _sprite) {
  sprite = _sprite;

  labelImage->setBackgroundRole(QPalette::LinkVisited);
  labelImage->setSizePolicy(QSizePolicy::Ignored,
                            QSizePolicy::Ignored);
  labelImage->setScaledContents(false);
  labelImage->setSizePolicy(QSizePolicy::MinimumExpanding,
                            QSizePolicy::MinimumExpanding);
  QPixmap pixmap = getPixmap();
  if (pixmap.isNull()) {
    labelImage->resize(QSize());
  } else {
    QSize size = pixmap.size();
    size *= 2;
    pixmap = pixmap.scaled(size);
    labelImage->resize(size);
  }
  labelImage->setPixmap(pixmap);

  update();
}